

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# weapon.c
# Opt level: O3

int weapon_dam_bonus(obj *weapon)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char cVar4;
  skills sVar5;
  uint uVar6;
  
  iVar2 = weapon_type(weapon);
  if ((u.twoweap == '\0') || ((uwep != weapon && (uswapwep != weapon)))) {
    uVar6 = 0;
    if (iVar2 != 0) {
      if (iVar2 < 0x1e) {
        uVar6 = (uint)u.weapon_skills[iVar2].skill;
        if (uVar6 < 5) {
          uVar6 = *(uint *)(&DAT_002d9cac + ((ulong)uVar6 & 0xff) * 4);
        }
        else {
          impossible("weapon_dam_bonus: bad skill %d");
          uVar6 = 0xfffffffb;
        }
      }
      else if (iVar2 == 0x25) {
        sVar5.skill = '\x01';
        sVar5.max_skill = '\0';
        sVar5.advance = 0;
        if ('\x01' < u.weapon_skills[0x25].skill) {
          sVar5 = u.weapon_skills[0x25];
        }
        iVar3 = 3;
        if (urole.malenum != 0x165) {
          iVar3 = (urole.malenum == 0x160) + 1 + (uint)(urole.malenum == 0x160);
        }
        uVar6 = iVar3 * ((uint)sVar5 & 0xff) >> 1;
      }
      else {
        uVar6 = 0;
        if (iVar2 == 0x26) goto LAB_002869be;
      }
    }
    if ((iVar2 != 0x26) && (u.usteed != (monst *)0x0)) {
      if (u.weapon_skills[0x27].skill == '\x04') {
        uVar6 = uVar6 + 5;
      }
      else if (u.weapon_skills[0x27].skill == '\x03') {
        uVar6 = uVar6 + 2;
      }
    }
  }
  else {
LAB_002869be:
    cVar1 = u.weapon_skills[iVar2].skill;
    cVar4 = u.weapon_skills[0x26].skill;
    if (cVar1 < u.weapon_skills[0x26].skill) {
      cVar4 = cVar1;
    }
    uVar6 = 0xfffffffd;
    if ((byte)(cVar4 - 2U) < 3) {
      uVar6 = *(uint *)(&DAT_002d9cc0 + (ulong)(byte)(cVar4 - 2U) * 4);
    }
  }
  return uVar6;
}

Assistant:

int weapon_dam_bonus(struct obj *weapon)
{
    int type, wep_type, skill, bonus = 0;

    wep_type = weapon_type(weapon);
    /* use two weapon skill only if attacking with one of the wielded weapons */
    type = (u.twoweap && (weapon == uwep || weapon == uswapwep)) ?
	    P_TWO_WEAPON_COMBAT : wep_type;
    if (type == P_NONE) {
	bonus = 0;
    } else if (type <= P_LAST_WEAPON) {
	switch (P_SKILL(type)) {
	    default: impossible("weapon_dam_bonus: bad skill %d",P_SKILL(type));
		     /* fall through */
	    case P_ISRESTRICTED: bonus = -5; break;
	    case P_UNSKILLED:	bonus = -2; break;
	    case P_BASIC:	bonus =  0; break;
	    case P_SKILLED:	bonus =  1; break;
	    case P_EXPERT:	bonus =  3; break;
	}
    } else if (type == P_TWO_WEAPON_COMBAT) {
	skill = P_SKILL(P_TWO_WEAPON_COMBAT);
	if (P_SKILL(wep_type) < skill) skill = P_SKILL(wep_type);
	switch (skill) {
	    default:
	    case P_ISRESTRICTED:
	    case P_UNSKILLED:	bonus = -3; break;
	    case P_BASIC:	bonus = -1; break;
	    case P_SKILLED:	bonus = 0; break;
	    case P_EXPERT:	bonus = 2; break;
	}
    } else if (type == P_BARE_HANDED_COMBAT) {
	/*
	 *	       b.h.  m.a.
	 *	unskl:	 0   n/a
	 *	basic:	+1    +3
	 *	skild:	+1    +4
	 *	exprt:	+2    +6
	 *	mastr:	+2    +7
	 *	grand:	+3    +9
	 */
	bonus = P_SKILL(type);
	bonus = max(bonus,P_UNSKILLED) - 1;	/* unskilled => 0 */
	bonus = ((bonus + 1) * (martial_bonus() ? 3 : 1)) / 2;
    }

	/* KMH -- Riding gives some thrusting damage */
	if (u.usteed && type != P_TWO_WEAPON_COMBAT) {
		switch (P_SKILL(P_RIDING)) {
		    case P_ISRESTRICTED:
		    case P_UNSKILLED:   break;
		    case P_BASIC:       break;
		    case P_SKILLED:     bonus += 2; break;
		    case P_EXPERT:      bonus += 5; break;
		}
	}

    return bonus;
}